

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O3

ON_BrepFace * __thiscall ON_BrepTrim::Face(ON_BrepTrim *this)

{
  int iVar1;
  ON_Brep *pOVar2;
  
  pOVar2 = this->m_brep;
  if (pOVar2 != (ON_Brep *)0x0) {
    iVar1 = this->m_li;
    if ((-1 < (long)iVar1) &&
       (iVar1 < (pOVar2->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
                m_count)) {
      iVar1 = (pOVar2->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a
              [iVar1].m_fi;
      if ((-1 < (long)iVar1) &&
         (iVar1 < (pOVar2->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                  m_count)) {
        return (pOVar2->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a
               + iVar1;
      }
    }
  }
  return (ON_BrepFace *)0x0;
}

Assistant:

ON_BrepFace* ON_BrepTrim::Face() const
{
  ON_BrepFace* face = 0;
  if ( m_brep && m_li >= 0 && m_li < m_brep->m_L.Count() )
  {
    int fi = m_brep->m_L[m_li].m_fi;
    if ( fi >= 0 && fi < m_brep->m_F.Count() )
      face = &m_brep->m_F[fi];
  }
  return face;
}